

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.cpp
# Opt level: O3

int Potassco::xconvert(char *x,bool *out,char **errPos,int param_4)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  
  if (x == (char *)0x0) {
LAB_0019d94d:
    iVar2 = 0;
    goto LAB_0019d9f4;
  }
  bVar1 = *x;
  bVar3 = true;
  if (bVar1 < 0x6e) {
    if (bVar1 == 0) goto LAB_0019d94d;
    lVar4 = 1;
    if (bVar1 != 0x30) {
      if (bVar1 == 0x31) goto LAB_0019d9e9;
      goto LAB_0019d9ab;
    }
LAB_0019d9e7:
    bVar3 = false;
LAB_0019d9e9:
    *out = bVar3;
    x = x + lVar4;
  }
  else {
    if (bVar1 == 0x6e) {
      if (x[1] != 'o') goto LAB_0019d9ab;
      lVar4 = 2;
      goto LAB_0019d9e7;
    }
    if (bVar1 == 0x6f) {
      lVar4 = 2;
      if (x[1] != 'n') {
        if ((x[1] == 'f') && (x[2] == 'f')) {
          lVar4 = 3;
          goto LAB_0019d9e7;
        }
        goto LAB_0019d9ab;
      }
      goto LAB_0019d9e9;
    }
    if (((bVar1 == 0x79) && (x[1] == 'e')) && (lVar4 = 3, x[2] == 's')) goto LAB_0019d9e9;
LAB_0019d9ab:
    lVar4 = 4;
    iVar2 = strncmp(x,"true",4);
    if (iVar2 == 0) goto LAB_0019d9e9;
    lVar4 = 5;
    iVar2 = strncmp(x,"false",5);
    if (iVar2 == 0) goto LAB_0019d9e7;
  }
  iVar2 = 1;
LAB_0019d9f4:
  if (errPos != (char **)0x0) {
    *errPos = x;
  }
  return iVar2;
}

Assistant:

int xconvert(const char* x, bool& out, const char** errPos, int) {
	if      (empty(x, errPos))           { return 0; }
	else if (*x == '1')                  { out = true;  x += 1; }
	else if (*x == '0')                  { out = false; x += 1; }
	else if (strncmp(x, "no", 2)  == 0)  { out = false; x += 2; }
	else if (strncmp(x, "on", 2)  == 0)  { out = true;  x += 2; }
	else if (strncmp(x, "yes", 3) == 0)  { out = true;  x += 3; }
	else if (strncmp(x, "off", 3) == 0)  { out = false; x += 3; }
	else if (strncmp(x, "true", 4) == 0) { out = true;  x += 4; }
	else if (strncmp(x, "false", 5) == 0){ out = false; x += 5; }
	return parsed(1, x, errPos);
}